

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> * __thiscall
cfd::core::Psbt::GetTxInKeyDataList
          (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__return_storage_ptr__,
          Psbt *this,uint32_t index)

{
  size_type sVar1;
  pointer puVar2;
  ulong uVar3;
  size_t __n;
  uint *__args;
  long lVar4;
  long lVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  ByteData fingerprint;
  ByteData key;
  Pubkey pubkey;
  ByteData local_228;
  void *local_208;
  iterator iStack_200;
  uint *local_1f8;
  ByteData local_1f0;
  ByteData local_1d8;
  size_type local_1c0;
  long local_1b8;
  void *local_1b0;
  size_type local_1a8;
  Pubkey local_1a0;
  KeyData local_188;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xa67,"GetTxInKeyDataList");
  local_1b0 = this->wally_psbt_pointer_;
  local_1b8 = (ulong)index * 0x110;
  sVar1 = *(size_type *)(*(long *)((long)local_1b0 + 0x10) + 0x50 + local_1b8);
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::reserve
            (__return_storage_ptr__,sVar1);
  if (sVar1 != 0) {
    local_1a8 = 0;
    local_1c0 = sVar1;
    do {
      lVar5 = *(long *)(*(long *)((long)local_1b0 + 0x10) + 0x48 + local_1b8);
      lVar4 = local_1a8 * 0x20;
      ByteData::ByteData(&local_1d8,*(uint8_t **)(lVar5 + lVar4),*(uint32_t *)(lVar5 + 8 + lVar4));
      local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar3 = (long)local_1d8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1d8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar3 == 0) {
        puVar2 = (pointer)0x0;
      }
      else {
        if ((long)uVar3 < 0) {
          ::std::__throw_bad_alloc();
        }
        puVar2 = (pointer)operator_new(uVar3);
      }
      local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar2 + uVar3;
      __n = (long)local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar2;
      if (__n != 0) {
        local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
        memmove(puVar2,local_1d8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
      }
      local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2 + __n;
      Pubkey::Pubkey(&local_1a0,&local_228);
      if (local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ByteData::ByteData(&local_1f0);
      lVar5 = lVar5 + lVar4;
      local_208 = (void *)0x0;
      iStack_200._M_current = (uint *)0x0;
      local_1f8 = (uint *)0x0;
      if (*(ulong *)(lVar5 + 0x18) != 0 && (*(ulong *)(lVar5 + 0x18) & 3) == 0) {
        ByteData::ByteData((ByteData *)&local_188,*(uint8_t **)(lVar5 + 0x10),4);
        puVar2 = local_1f0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_1f0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_188.pubkey_.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_1f0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_188.pubkey_.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1f0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_188.pubkey_.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_188.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_188.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_188.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2);
        }
        if (local_188.pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (7 < *(ulong *)(lVar5 + 0x18)) {
          __args = *(uint **)(lVar5 + 0x10);
          lVar5 = (*(ulong *)(lVar5 + 0x18) >> 2) - 1;
          do {
            __args = __args + 1;
            if (iStack_200._M_current == local_1f8) {
              ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_208,iStack_200,
                         __args);
            }
            else {
              *iStack_200._M_current = *__args;
              iStack_200._M_current = iStack_200._M_current + 1;
            }
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
      }
      KeyData::KeyData(&local_188,&local_1a0,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,&local_1f0)
      ;
      ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
      emplace_back<cfd::core::KeyData>(__return_storage_ptr__,&local_188);
      sVar1 = local_1c0;
      KeyData::~KeyData(&local_188);
      if (local_208 != (void *)0x0) {
        operator_delete(local_208);
      }
      if (local_1f0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_1a8 = local_1a8 + 1;
    } while (local_1a8 != sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<KeyData> Psbt::GetTxInKeyDataList(uint32_t index) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  size_t key_max = psbt_pointer->inputs[index].keypaths.num_items;
  std::vector<KeyData> arr;
  arr.reserve(key_max);
  struct wally_map_item *item;
  for (size_t key_index = 0; key_index < key_max; ++key_index) {
    item = &psbt_pointer->inputs[index].keypaths.items[key_index];
    ByteData key(item->key, static_cast<uint32_t>(item->key_len));
    Pubkey pubkey(key);
    ByteData fingerprint;
    std::vector<uint32_t> path;
    if (((item->value_len % 4) == 0) && (item->value_len > 0)) {
      fingerprint = ByteData(item->value, 4);

      // TODO(k-matsuzawa) Need endian support.
      size_t arr_max = item->value_len / 4;
      uint32_t *val_arr = reinterpret_cast<uint32_t *>(item->value);
      for (size_t arr_index = 1; arr_index < arr_max; ++arr_index) {
        path.push_back(val_arr[arr_index]);
      }
    }
    arr.emplace_back(KeyData(pubkey, path, fingerprint));
  }
  return arr;
}